

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_block_flattened(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  SPIRType *type;
  size_t sVar2;
  CompilerError *pCVar3;
  BaseType basic_type;
  size_t buffer_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  string buffer_name;
  Bitset flags;
  undefined1 local_168 [192];
  uint *local_a8;
  size_t local_a0;
  size_t local_98;
  uint local_90 [8];
  undefined1 local_70 [28];
  TypeID local_54;
  __node_base_ptr *local_50;
  size_type local_48;
  __node_base local_40;
  size_type sStack_38;
  float local_30;
  size_t local_28;
  __node_base_ptr p_Stack_20;
  
  type = Compiler::get<spirv_cross::SPIRType>
                   (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&buffer_name,this,(ulong)(type->super_IVariant).self.id,0);
  sVar2 = Compiler::get_declared_struct_size(&this->super_Compiler,type);
  buffer_size = sVar2 + 0xf >> 4;
  bVar1 = Compiler::get_common_basic_type(&this->super_Compiler,type,&basic_type);
  if (!bVar1) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar3,"All basic types in a flattened block must be the same.");
    __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_168._32_8_ = local_168 + 0x38;
  local_168._8_4_ = 0;
  local_168._0_8_ = &PTR__SPIRType_004e8f68;
  local_168._12_4_ = 0x17;
  local_168._20_4_ = 0;
  local_168._28_4_ = 1;
  local_168._40_8_ = 0;
  local_168._48_8_ = 8;
  local_168._88_8_ = local_168 + 0x70;
  local_168._96_8_ = 0;
  local_168._104_8_ = 8;
  local_168._120_4_ = 0;
  local_168[0x7c] = false;
  local_168[0x7d] = false;
  local_168._128_4_ = Generic;
  local_168._136_8_ = local_168 + 0xa0;
  local_168._144_8_ = 0;
  local_168._152_8_ = 8;
  local_a8 = local_90;
  local_a0 = 0;
  local_98 = 8;
  local_50 = &p_Stack_20;
  local_70._0_7_ = 0;
  local_70._7_4_ = 0;
  local_70._12_4_ = 0;
  local_70._16_4_ = ImageFormatUnknown;
  local_70._20_4_ = AccessQualifierReadOnly;
  local_70._24_4_ = 0;
  local_54.id = 0;
  local_48 = 1;
  local_40._M_nxt = (_Hash_node_base *)0x0;
  sStack_38 = 0;
  local_30 = 1.0;
  local_28 = 0;
  p_Stack_20 = (__node_base_ptr)0x0;
  local_168._16_4_ = basic_type;
  local_168._24_4_ = 4;
  if ((basic_type < Double) && ((0x2180U >> (basic_type & (Image|Struct)) & 1) != 0)) {
    ParsedIR::get_buffer_block_flags(&flags,&(this->super_Compiler).ir,var);
    flags_to_qualifiers_glsl_abi_cxx11_(&local_1e8,this,(SPIRType *)local_168,&flags);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_208,this,local_168,0);
    statement<char_const(&)[9],std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_long&,char_const(&)[3]>
              (this,(char (*) [9])"uniform ",&local_1e8,&local_208,(char (*) [2])0x36c2c9,
               &buffer_name,(char (*) [2])0x349808,&buffer_size,(char (*) [3])0x388bf5);
    ::std::__cxx11::string::~string((string *)&local_208);
    ::std::__cxx11::string::~string((string *)&local_1e8);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&flags.higher._M_h);
    SPIRType::~SPIRType((SPIRType *)local_168);
    ::std::__cxx11::string::~string((string *)&buffer_name);
    return;
  }
  pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(pCVar3,"Basic types in a flattened UBO must be float, int or uint.");
  __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::emit_buffer_block_flattened(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	// Block names should never alias.
	auto buffer_name = to_name(type.self, false);
	size_t buffer_size = (get_declared_struct_size(type) + 15) / 16;

	SPIRType::BaseType basic_type;
	if (get_common_basic_type(type, basic_type))
	{
		SPIRType tmp { OpTypeVector };
		tmp.basetype = basic_type;
		tmp.vecsize = 4;
		if (basic_type != SPIRType::Float && basic_type != SPIRType::Int && basic_type != SPIRType::UInt)
			SPIRV_CROSS_THROW("Basic types in a flattened UBO must be float, int or uint.");

		auto flags = ir.get_buffer_block_flags(var);
		statement("uniform ", flags_to_qualifiers_glsl(tmp, flags), type_to_glsl(tmp), " ", buffer_name, "[",
		          buffer_size, "];");
	}
	else
		SPIRV_CROSS_THROW("All basic types in a flattened block must be the same.");
}